

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::SocketAddress::LookupReader>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::SocketAddress::LookupReader> *this,void *pointer)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  _Link_type __x;
  
  if (pointer != (void *)0x0) {
    __x = (_Link_type)pointer;
    if (*(Thread **)((long)pointer + 8) != (Thread *)0x0) {
      Thread::detach(*(Thread **)((long)pointer + 8));
    }
    std::
    _Rb_tree<kj::(anonymous_namespace)::SocketAddress,_kj::(anonymous_namespace)::SocketAddress,_std::_Identity<kj::(anonymous_namespace)::SocketAddress>,_std::less<kj::(anonymous_namespace)::SocketAddress>,_std::allocator<kj::(anonymous_namespace)::SocketAddress>_>
    ::_M_erase(*(_Rb_tree<kj::(anonymous_namespace)::SocketAddress,_kj::(anonymous_namespace)::SocketAddress,_std::_Identity<kj::(anonymous_namespace)::SocketAddress>,_std::less<kj::(anonymous_namespace)::SocketAddress>,_std::allocator<kj::(anonymous_namespace)::SocketAddress>_>
                 **)((long)pointer + 0xe0),__x);
    lVar1 = *(long *)((long)pointer + 0xb0);
    if (lVar1 != 0) {
      lVar2 = *(long *)((long)pointer + 0xb8);
      lVar3 = *(long *)((long)pointer + 0xc0);
      *(undefined8 *)((long)pointer + 0xb0) = 0;
      *(undefined8 *)((long)pointer + 0xb8) = 0;
      *(undefined8 *)((long)pointer + 0xc0) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 200))
                (*(undefined8 **)((long)pointer + 200),lVar1,0x88,
                 (lVar2 - lVar1 >> 3) * -0xf0f0f0f0f0f0f0f,(lVar3 - lVar1 >> 3) * -0xf0f0f0f0f0f0f0f
                 ,0);
    }
    plVar4 = *(long **)((long)pointer + 0x18);
    if (plVar4 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x18) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x10))
                (*(undefined8 **)((long)pointer + 0x10),(long)plVar4 + *(long *)(*plVar4 + -0x10));
    }
    if (*(long *)((long)pointer + 8) != 0) {
      *(undefined8 *)((long)pointer + 8) = 0;
      (**(code **)**pointer)();
    }
    operator_delete(pointer,0x100);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }